

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.cpp
# Opt level: O1

XMLElement * __thiscall Kumu::XMLElement::AddChild(XMLElement *this,XMLElement *element)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)element;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->m_ChildList).
            super__List_base<Kumu::XMLElement_*,_std::allocator<Kumu::XMLElement_*>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return element;
}

Assistant:

Kumu::XMLElement*
Kumu::XMLElement::AddChild(Kumu::XMLElement* element)
{
  m_ChildList.push_back(element); // takes posession!
  return element;
}